

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_arith_compute_ov
               (DisasContext_conflict10 *ctx,TCGv_i64 arg0,TCGv_i64 arg1,TCGv_i64 arg2,int sub)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_xor_i64_ppc64(tcg_ctx,cpu_ov,arg0,arg2);
  tcg_gen_xor_i64_ppc64(tcg_ctx,ret,arg1,arg2);
  if (sub == 0) {
    tcg_gen_andc_i64_ppc64(tcg_ctx,cpu_ov,cpu_ov,ret);
  }
  else {
    tcg_gen_and_i64_ppc64(tcg_ctx,cpu_ov,cpu_ov,ret);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  if (ctx->sf_mode == false) {
    tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ov,cpu_ov,0x1f,1);
    if ((ctx->insns_flags2 & 0x80000) != 0) {
      tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_ov32,cpu_ov);
    }
  }
  else {
    if ((ctx->insns_flags2 & 0x80000) != 0) {
      tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ov32,cpu_ov,0x1f,1);
    }
    tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ov,cpu_ov,0x3f,1);
  }
  tcg_gen_or_i64_ppc64(tcg_ctx,cpu_so,cpu_so,cpu_ov);
  return;
}

Assistant:

static inline void gen_op_arith_compute_ov(DisasContext *ctx, TCGv arg0,
                                           TCGv arg1, TCGv arg2, int sub)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    tcg_gen_xor_tl(tcg_ctx, cpu_ov, arg0, arg2);
    tcg_gen_xor_tl(tcg_ctx, t0, arg1, arg2);
    if (sub) {
        tcg_gen_and_tl(tcg_ctx, cpu_ov, cpu_ov, t0);
    } else {
        tcg_gen_andc_tl(tcg_ctx, cpu_ov, cpu_ov, t0);
    }
    tcg_temp_free(tcg_ctx, t0);
    if (NARROW_MODE(ctx)) {
        tcg_gen_extract_tl(tcg_ctx, cpu_ov, cpu_ov, 31, 1);
        if (is_isa300(ctx)) {
            tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
        }
    } else {
        if (is_isa300(ctx)) {
            tcg_gen_extract_tl(tcg_ctx, cpu_ov32, cpu_ov, 31, 1);
        }
        tcg_gen_extract_tl(tcg_ctx, cpu_ov, cpu_ov, TARGET_LONG_BITS - 1, 1);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);
}